

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::saveHistory(Cmd *this)

{
  pointer pbVar1;
  ostream *poVar2;
  string *entry;
  pointer pbVar3;
  ofstream file;
  char local_221;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  if ((this->history_file_).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::ofstream::ofstream(&local_220,(string *)&this->history_file_,_S_out);
    pbVar3 = (this->history_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->history_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 != pbVar1) {
      do {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_220,(pbVar3->_M_dataplus)._M_p,
                            pbVar3->_M_string_length);
        local_221 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_221,1);
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != pbVar1);
    }
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

void saveHistory() {
		if (history_file_) {
			std::ofstream file(*history_file_);
			for (const std::string &entry : history_) {
				file << entry << '\n';
			}
		}
	}